

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O3

void __thiscall
axl::sl::ConstructSingleton<axl::sys::lnx::libudev::UdevLib>::operator()
          (ConstructSingleton<axl::sys::lnx::libudev::UdevLib> *this,void *p)

{
  int iVar1;
  EVP_PKEY_CTX *src;
  Ptr<axl::g::Finalizer> local_18;
  
  sys::lnx::libudev::UdevLib::UdevLib((UdevLib *)p);
  if (g::getModule()::module == '\0') {
    iVar1 = __cxa_guard_acquire(&g::getModule()::module);
    if (iVar1 != 0) {
      g::Module::Module((Module *)g::getModule()::module);
      __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
      __cxa_guard_release(&g::getModule()::module);
    }
  }
  src = (EVP_PKEY_CTX *)operator_new(0x28,(nothrow_t *)&std::nothrow);
  *(undefined4 *)(src + 0x10) = 0;
  *(undefined4 *)(src + 0x14) = 1;
  *(undefined ***)src = &PTR__RefCount_0014cd10;
  *(undefined **)(src + 0x18) = &DAT_0014cd38;
  *(void **)(src + 0x20) = p;
  *(code **)(src + 8) = mem::deallocate;
  local_18.m_p = (Finalizer *)0x0;
  local_18.m_refCount = (RefCount *)0x0;
  rc::Ptr<axl::g::Finalizer>::copy(&local_18,src + 0x18,src);
  g::Module::addFinalizer((Module *)g::getModule()::module,&local_18);
  rc::Ptr<axl::g::Finalizer>::clear(&local_18);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}